

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O0

int __thiscall btMultiBodyJointMotor::getIslandIdA(btMultiBodyJointMotor *this)

{
  int iVar1;
  int iVar2;
  btCollisionObject *this_00;
  btMultibodyLink *pbVar3;
  long in_RDI;
  int i;
  btMultiBodyLinkCollider *col;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_1c;
  int local_4;
  
  this_00 = (btCollisionObject *)btMultiBody::getBaseCollider(*(btMultiBody **)(in_RDI + 8));
  if (this_00 == (btCollisionObject *)0x0) {
    local_1c = 0;
    while (iVar2 = local_1c, iVar1 = btMultiBody::getNumLinks((btMultiBody *)0x256727),
          iVar2 < iVar1) {
      pbVar3 = btMultiBody::getLink
                         ((btMultiBody *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      if (pbVar3->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar3 = btMultiBody::getLink
                           ((btMultiBody *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        iVar2 = btCollisionObject::getIslandTag((btCollisionObject *)pbVar3->m_collider);
        return iVar2;
      }
      local_1c = local_1c + 1;
    }
    local_4 = -1;
  }
  else {
    local_4 = btCollisionObject::getIslandTag(this_00);
  }
  return local_4;
}

Assistant:

int btMultiBodyJointMotor::getIslandIdA() const
{
	btMultiBodyLinkCollider* col = m_bodyA->getBaseCollider();
	if (col)
		return col->getIslandTag();
	for (int i=0;i<m_bodyA->getNumLinks();i++)
	{
		if (m_bodyA->getLink(i).m_collider)
			return m_bodyA->getLink(i).m_collider->getIslandTag();
	}
	return -1;
}